

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O0

void Aig_ObjPatchFanin0(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFaninNew)

{
  int iVar1;
  uint uVar2;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pFaninOld;
  Aig_Obj_t *pFaninNew_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                  ,0x11d,"void Aig_ObjPatchFanin0(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsCo(pObj);
  if (iVar1 != 0) {
    pObj_00 = Aig_ObjFanin0(pObj);
    if (p->pFanData != (int *)0x0) {
      Aig_ObjRemoveFanout(p,pObj_00,pObj);
    }
    Aig_ObjDeref(pObj_00);
    pObj->pFanin0 = pFaninNew;
    uVar2 = Aig_ObjLevelNew(pObj);
    *(ulong *)&pObj->field_0x18 =
         *(ulong *)&pObj->field_0x18 & 0xff000000ffffffff | ((ulong)uVar2 & 0xffffff) << 0x20;
    uVar2 = Aig_ObjPhaseReal(pObj->pFanin0);
    *(ulong *)&pObj->field_0x18 =
         *(ulong *)&pObj->field_0x18 & 0xfffffffffffffff7 | ((ulong)uVar2 & 1) << 3;
    if (p->pFanData != (int *)0x0) {
      pAVar3 = Aig_ObjFanin0(pObj);
      Aig_ObjAddFanout(p,pAVar3,pObj);
    }
    pAVar3 = Aig_ObjFanin0(pObj);
    Aig_ObjRef(pAVar3);
    iVar1 = Aig_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsConst1(pObj_00);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjRefs(pObj_00);
        if (iVar1 == 0) {
          Aig_ObjDelete_rec(p,pObj_00,1);
        }
      }
    }
    return;
  }
  __assert_fail("Aig_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigObj.c"
                ,0x11e,"void Aig_ObjPatchFanin0(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ObjPatchFanin0( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFaninNew )
{
    Aig_Obj_t * pFaninOld;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsCo(pObj) );
    pFaninOld = Aig_ObjFanin0(pObj);
    // decrement ref and remove fanout
    if ( p->pFanData )
        Aig_ObjRemoveFanout( p, pFaninOld, pObj );
    Aig_ObjDeref( pFaninOld );
    // update the fanin
    pObj->pFanin0 = pFaninNew;
    pObj->Level = Aig_ObjLevelNew( pObj );
    pObj->fPhase = Aig_ObjPhaseReal(pObj->pFanin0);
    // increment ref and add fanout
    if ( p->pFanData )
        Aig_ObjAddFanout( p, Aig_ObjFanin0(pObj), pObj );
    Aig_ObjRef( Aig_ObjFanin0(pObj) );
    // get rid of old fanin
    if ( !Aig_ObjIsCi(pFaninOld) && !Aig_ObjIsConst1(pFaninOld) && Aig_ObjRefs(pFaninOld) == 0 )
        Aig_ObjDelete_rec( p, pFaninOld, 1 );
}